

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_A.cpp
# Opt level: O0

void __thiscall A::~A(A *this)

{
  ostream *poVar1;
  int *in_RDI;
  scoped_lock l;
  spin_mutex_t *in_stack_ffffffffffffffb8;
  scoped_lock *in_stack_ffffffffffffffc0;
  
  spin_mutex_t::scoped_lock::scoped_lock(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Destroying A of sz=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RDI);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x1255c5);
  if (*(void **)(in_RDI + 2) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 2));
  }
  if (*(void **)(in_RDI + 4) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 4));
  }
  if (*(void **)(in_RDI + 6) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 6));
  }
  return;
}

Assistant:

~A() {
    LOG("Destroying A of sz=" << n_);
    delete [] a;
    delete [] b;
    delete [] c;
  }